

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

int parse_expr(lword current_addr,lword *result)

{
  lword lVar1;
  lword in_RDI;
  int abs;
  Expr *tree;
  lword saved_caddr;
  undefined4 local_28;
  
  lVar1 = caddr;
  caddr = in_RDI;
  skip();
  expression();
  if (caddr == -2) {
    local_28 = 1;
  }
  else {
    local_28 = eval_expr((Expr *)current_addr,result);
  }
  free_expr((Expr *)0x11deec);
  caddr = lVar1;
  return local_28;
}

Assistant:

int parse_expr(lword current_addr,lword *result)
/* Tries to parse the input stream. Returns !0 for an absolute result.
   If current_addr = -1 then '.' is not defined and only references
   to absolute symbols are allowed.
   If current_addr = -2 then no expression evaluation takes place
   at all. The expression is just skipped. */
{
  lword saved_caddr = caddr;
  struct Expr *tree;
  int abs;

  caddr = current_addr;
  skip();
  tree = expression();
  abs = caddr==-2 ? 1 : eval_expr(tree,result);
  free_expr(tree);
  caddr = saved_caddr;
  return abs;
}